

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eeep_parse.c
# Opt level: O1

void ParseExpressCard(ExpCardBlock_t *dblock,int size)

{
  byte bVar1;
  ulong uVar2;
  
  printf("   Express Card block:\n      Card: %d, USB Port: %d, PCIExpress Port: %d\n",
         (ulong)dblock->ExpressCardNumber,(ulong)(dblock->ComExpressPort >> 5),
         (ulong)(dblock->ComExpressPort & 0x1f));
  printf("      Switch Addresses: ");
  if (0 < (int)(size - 5U)) {
    uVar2 = 0;
    do {
      bVar1 = dblock->SwitchDevFuncAddr[uVar2];
      if (bVar1 == 0xff) break;
      if (uVar2 != 0) {
        printf(", ");
      }
      printf("%d:%d",(ulong)(bVar1 >> 3),(ulong)(bVar1 & 7));
      uVar2 = uVar2 + 1;
    } while (size - 5U != uVar2);
  }
  putchar(10);
  return;
}

Assistant:

void ParseExpressCard(ExpCardBlock_t *dblock, int size)
{
	int addr_array_size = size - FIELD_OFFSET(ExpCardBlock_t, SwitchDevFuncAddr);
	printf("   Express Card block:\n      Card: %d, USB Port: %d, PCIExpress Port: %d\n", 
		dblock->ExpressCardNumber, dblock->ComExpressPort >> 5, dblock->ComExpressPort & 0x1F);
	printf("      Switch Addresses: ");
	for( int i = 0; i < addr_array_size; i++ ) {
		uint8_t dev_func = dblock->SwitchDevFuncAddr[i];
		if(dev_func == 0xFF)
			break;
		if(i != 0) {
			printf(", ");
		}
		printf("%d:%d", dev_func >> 3, dev_func & 7);
	}
	printf("\n");
}